

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void sexp_set_parameter(sexp ctx,sexp env,sexp name,sexp value)

{
  sexp tail;
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp param;
  
  tail = sexp_env_ref(param,in_RDI,in_RSI,in_RDX);
  if ((((ulong)tail & 3) == 0) && (tail->tag == 0x1b)) {
    if ((((tail->value).string.offset & 3) == 0) && (((tail->value).type.cpl)->tag == 6)) {
      (((tail->value).type.cpl)->value).type.cpl = in_RCX;
    }
    else {
      psVar1 = sexp_cons_op(in_RDI,in_RSI,(sexp_sint_t)in_RDX,in_RCX,tail);
      (tail->value).type.cpl = psVar1;
    }
  }
  else {
    sexp_warn(name,(char *)value,param);
  }
  return;
}

Assistant:

void sexp_set_parameter (sexp ctx, sexp env, sexp name, sexp value) {
  sexp param = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_opcodep(param)) {
    if (! sexp_pairp(sexp_opcode_data(param)))
      sexp_opcode_data(param) = sexp_cons(ctx, name, value);
    else
      sexp_cdr(sexp_opcode_data(param)) = value;
  } else {
    sexp_warn(ctx, "can't set non-parameter: ", name);
  }
}